

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_noderel.cc
# Opt level: O0

RC __thiscall QL_NodeRel::GetNext(QL_NodeRel *this,char *data)

{
  undefined1 local_48 [8];
  RM_Record rec;
  char *recData;
  RC rc;
  char *data_local;
  QL_NodeRel *this_local;
  
  RM_Record::RM_Record((RM_Record *)local_48);
  this_local._4_4_ = RetrieveNextRec(this,(RM_Record *)local_48,(char **)&rec.size);
  if (this_local._4_4_ == 0) {
    memcpy(data,(void *)rec._16_8_,(long)(this->super_QL_Node).tupleLength);
    this_local._4_4_ = 0;
  }
  else if ((this_local._4_4_ == 0x6e) || (this_local._4_4_ == 0xd3)) {
    this_local._4_4_ = 0x199;
  }
  RM_Record::~RM_Record((RM_Record *)local_48);
  return this_local._4_4_;
}

Assistant:

RC QL_NodeRel::GetNext(char *data){
  RC rc = 0;
  char *recData;
  RM_Record rec;
  if((rc = RetrieveNextRec(rec, recData))){
    if(rc == RM_EOF || rc == IX_EOF){
      return (QL_EOI);
    }
    return (rc);
  }
  memcpy(data, recData, tupleLength);
  return (0);
}